

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O3

void multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  uchar **ppuVar1;
  byte bVar2;
  uint j;
  uchar *puVar3;
  pointer pppuVar4;
  size_t sVar5;
  pointer pppuVar6;
  long lVar7;
  vector_brodnik<unsigned_char_*> *this;
  uchar **ppuVar8;
  byte bVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  uint j_1;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  array<vector_brodnik<unsigned_char_*>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  long local_158;
  long local_150;
  vector_brodnik<unsigned_char_*> local_110;
  vector_brodnik<unsigned_char_*> local_d8;
  vector_brodnik<unsigned_char_*> local_a0;
  ulong local_68;
  size_t local_60;
  long local_58;
  byte abStack_50 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  lVar13 = 0;
  do {
    this = (vector_brodnik<unsigned_char_*> *)
           ((long)&local_110._index_block.
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13);
    (this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined8 *)
     ((long)&local_110._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar13) = 0;
    *(undefined8 *)
     ((long)&local_110._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar13) = 0;
    vector_brodnik<unsigned_char_*>::clear(this);
    lVar13 = lVar13 + 0x38;
  } while (lVar13 != 0xa8);
  bVar2 = pseudo_median<unsigned_char>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    sVar11 = 0;
  }
  else {
    sVar11 = 0;
    ppuVar8 = strings;
    do {
      lVar13 = 0;
      do {
        if (ppuVar8[lVar13] == (uchar *)0x0) goto LAB_0021d63d;
        abStack_50[lVar13] = ppuVar8[lVar13][depth];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      lVar13 = 0;
      do {
        lVar7 = (ulong)(abStack_50[lVar13] == bVar2) + (ulong)(bVar2 < abStack_50[lVar13]) * 2;
        sVar17 = (&local_110)[lVar7]._left_in_block;
        if (sVar17 == 0) {
          vector_brodnik<unsigned_char_*>::grow(&local_110 + lVar7);
          sVar17 = (&local_110)[lVar7]._left_in_block;
        }
        puVar3 = ppuVar8[lVar13];
        ppuVar1 = (&local_110)[lVar7]._insertpos;
        (&local_110)[lVar7]._insertpos = ppuVar1 + 1;
        *ppuVar1 = puVar3;
        (&local_110)[lVar7]._left_in_block = sVar17 - 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      sVar11 = sVar11 + 0x20;
      ppuVar8 = ppuVar8 + 0x20;
    } while (sVar11 < (N & 0xffffffffffffffe0));
  }
  if (sVar11 < N) {
    do {
      puVar3 = strings[sVar11];
      if (puVar3 == (uchar *)0x0) {
LAB_0021d63d:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      lVar13 = (ulong)(puVar3[depth] == bVar2) + (ulong)(bVar2 < puVar3[depth]) * 2;
      sVar17 = (&local_110)[lVar13]._left_in_block;
      if (sVar17 == 0) {
        vector_brodnik<unsigned_char_*>::grow(&local_110 + lVar13);
        sVar17 = (&local_110)[lVar13]._left_in_block;
        puVar3 = strings[sVar11];
      }
      ppuVar8 = (&local_110)[lVar13]._insertpos;
      (&local_110)[lVar13]._insertpos = ppuVar8 + 1;
      *ppuVar8 = puVar3;
      (&local_110)[lVar13]._left_in_block = sVar17 - 1;
      sVar11 = sVar11 + 1;
    } while (N != sVar11);
  }
  lVar7 = (long)(2 << (local_110._superblock & 0x1f)) + -0x40;
  lVar13 = local_110._left_in_superblock * local_110._block_size + local_110._left_in_block;
  sVar17 = lVar7 - lVar13;
  lVar14 = local_d8._left_in_superblock * local_d8._block_size + local_d8._left_in_block;
  lVar12 = (long)(2 << (local_d8._superblock & 0x1f)) + -0x40;
  sVar11 = lVar12 - lVar14;
  local_58 = (long)(2 << (local_a0._superblock & 0x1f)) + -0x40;
  lVar10 = local_a0._left_in_superblock * local_a0._block_size + local_a0._left_in_block;
  local_60 = local_58 - lVar10;
  if (sVar11 + sVar17 + local_60 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_brodnik<unsigned char *>, CharT = unsigned char]"
                 );
  }
  if (lVar7 != lVar13) {
    pppuVar4 = local_110._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppuVar8 = strings;
    if (local_110._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_110._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_150 = 8;
      uVar15 = 0;
      lVar13 = 8;
      bVar9 = 0;
      pppuVar6 = local_110._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        uVar16 = uVar15;
        if (lVar13 != 0) {
          lVar7 = lVar13;
          local_68 = uVar15;
          do {
            pppuVar4 = local_110._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            if (uVar15 == ((long)local_110._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_110._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021d31f;
            if (local_150 != 0) {
              memmove(ppuVar8,local_110._index_block.
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15],local_150 * 8);
            }
            uVar15 = uVar15 + 1;
            ppuVar8 = ppuVar8 + local_150;
            lVar7 = lVar7 + -1;
            pppuVar4 = local_110._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            uVar16 = local_68;
            pppuVar6 = local_110._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (lVar7 != 0);
        }
        uVar15 = uVar16 + lVar13;
        lVar13 = lVar13 << bVar9;
        bVar9 = bVar9 ^ 1;
        local_150 = local_150 << bVar9;
      } while (uVar15 < (ulong)((long)pppuVar4 - (long)pppuVar6 >> 3));
    }
LAB_0021d31f:
    sVar5 = (long)local_110._insertpos - (long)pppuVar4[-1];
    if (sVar5 != 0) {
      memmove(ppuVar8,pppuVar4[-1],sVar5);
    }
  }
  if (lVar12 != lVar14) {
    ppuVar8 = strings + sVar17;
    pppuVar4 = local_d8._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_d8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_d8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_158 = 8;
      uVar15 = 0;
      lVar13 = 8;
      bVar9 = 0;
      pppuVar6 = local_d8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        if (lVar13 != 0) {
          uVar16 = uVar15;
          lVar7 = lVar13;
          do {
            pppuVar4 = local_d8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            if (uVar16 == ((long)local_d8._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021d430;
            if (local_158 != 0) {
              memmove(ppuVar8,local_d8._index_block.
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16],local_158 * 8);
            }
            uVar16 = uVar16 + 1;
            ppuVar8 = ppuVar8 + local_158;
            lVar7 = lVar7 + -1;
            pppuVar4 = local_d8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            pppuVar6 = local_d8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (lVar7 != 0);
        }
        uVar15 = uVar15 + lVar13;
        lVar13 = lVar13 << bVar9;
        bVar9 = bVar9 ^ 1;
        local_158 = local_158 << bVar9;
      } while (uVar15 < (ulong)((long)pppuVar4 - (long)pppuVar6 >> 3));
    }
LAB_0021d430:
    sVar5 = (long)local_d8._insertpos - (long)pppuVar4[-1];
    if (sVar5 != 0) {
      memmove(ppuVar8,pppuVar4[-1],sVar5);
    }
  }
  if (local_58 != lVar10) {
    ppuVar8 = strings + sVar17 + sVar11;
    pppuVar4 = local_a0._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_a0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_158 = 8;
      uVar15 = 0;
      lVar13 = 8;
      bVar9 = 0;
      pppuVar6 = local_a0._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        if (lVar13 != 0) {
          uVar16 = uVar15;
          lVar7 = lVar13;
          do {
            pppuVar4 = local_a0._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            if (uVar16 == ((long)local_a0._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_a0._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021d59a;
            if (local_158 != 0) {
              memmove(ppuVar8,local_a0._index_block.
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16],local_158 * 8);
            }
            uVar16 = uVar16 + 1;
            ppuVar8 = ppuVar8 + local_158;
            lVar7 = lVar7 + -1;
            pppuVar4 = local_a0._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            pppuVar6 = local_a0._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (lVar7 != 0);
        }
        uVar15 = uVar15 + lVar13;
        lVar13 = lVar13 << bVar9;
        bVar9 = bVar9 ^ 1;
        local_158 = local_158 << bVar9;
      } while (uVar15 < (ulong)((long)pppuVar4 - (long)pppuVar6 >> 3));
    }
LAB_0021d59a:
    sVar5 = (long)local_a0._insertpos - (long)pppuVar4[-1];
    if (sVar5 != 0) {
      memmove(ppuVar8,pppuVar4[-1],sVar5);
    }
  }
  vector_brodnik<unsigned_char_*>::clear(&local_110);
  vector_brodnik<unsigned_char_*>::clear(&local_d8);
  vector_brodnik<unsigned_char_*>::clear(&local_a0);
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>(strings,sVar17,depth);
  if (bVar2 != 0) {
    multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>
              (strings + sVar17,sVar11,depth + 1);
  }
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>
            (strings + sVar17 + sVar11,local_60,depth);
  lVar13 = 0x70;
  do {
    vector_brodnik<unsigned_char_*>::~vector_brodnik
              ((vector_brodnik<unsigned_char_*> *)
               ((long)&local_110._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar13));
    lVar13 = lVar13 + -0x38;
  } while (lVar13 != -0x38);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}